

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

bool ON_ValidateMeshNgonUserData(ON_V4V5_MeshNgonUserData *ngud,ON_Mesh *mesh)

{
  int iVar1;
  int iVar2;
  ON_V4V5_MeshNgonList *pOVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ON_V4V5_MeshNgon *pOVar10;
  bool bVar11;
  
  pOVar3 = ngud->m_ngon_list;
  if (pOVar3 == (ON_V4V5_MeshNgonList *)0x0) {
LAB_0053a3f0:
    bVar11 = false;
  }
  else {
    iVar1 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    iVar2 = (mesh->m_F).m_count;
    iVar4 = ngud->m_mesh_V_count;
    if (iVar4 == 0 && ngud->m_mesh_F_count == 0) {
      ngud->m_mesh_F_count = -1;
      ngud->m_mesh_V_count = -1;
      uVar7 = 0;
      uVar6 = (ulong)(uint)pOVar3->m_ngons_count;
      if (pOVar3->m_ngons_count < 1) {
        uVar6 = uVar7;
      }
      for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
        if (pOVar3->m_ngons == (ON_V4V5_MeshNgon *)0x0) goto LAB_0053a3f0;
        pOVar10 = pOVar3->m_ngons + uVar7;
        uVar8 = (ulong)pOVar10->N;
        if ((long)uVar8 < 0) goto LAB_0053a3f0;
        uVar5 = 1;
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          iVar4 = pOVar10->vi[uVar9];
          if (iVar4 < 0) {
            return false;
          }
          if (iVar1 <= iVar4) {
            return false;
          }
          iVar4 = pOVar10->fi[uVar9];
          if ((iVar4 < 0) || (iVar2 <= iVar4)) goto joined_r0x0053a3b9;
          uVar5 = uVar5 + 1;
        }
LAB_0053a3dc:
      }
      ngud->m_mesh_V_count = iVar1;
      ngud->m_mesh_F_count = iVar2;
      iVar4 = iVar1;
    }
    else if (ngud->m_mesh_F_count != iVar2) goto LAB_0053a3f0;
    bVar11 = iVar4 == iVar1;
  }
  return bVar11;
joined_r0x0053a3b9:
  if (iVar4 != -1) goto LAB_0053a3f0;
  if (uVar8 <= uVar5) goto LAB_0053a3dc;
  iVar4 = pOVar10->vi[uVar5];
  if (iVar4 < 0) {
    return false;
  }
  if (iVar1 <= iVar4) {
    return false;
  }
  iVar4 = pOVar10->fi[uVar5];
  uVar5 = uVar5 + 1;
  goto joined_r0x0053a3b9;
}

Assistant:

static 
bool ON_ValidateMeshNgonUserData(
  ON_V4V5_MeshNgonUserData* ngud,
  const ON_Mesh& mesh
  )
{
  int i;
  if ( 0 == ngud || 0 == ngud->m_ngon_list )
    return false;

  const int mesh_V_count = mesh.m_V.Count();
  const int mesh_F_count = mesh.m_F.Count();

  if ( 0 == ngud->m_mesh_V_count && 0 == ngud->m_mesh_F_count )
  {
    // This is old user data that did not have validation counts
    // saved in the file.

    // Set validation counts to -1 so we never do this slow validation again.
    ngud->m_mesh_V_count = -1;
    ngud->m_mesh_F_count = -1;

    const int ngon_count = ngud->m_ngon_list->V4V5_NgonCount();

    for ( i = 0; i < ngon_count; i++ )
    {
      if ( !ON_ValidateNgon(ngud->m_ngon_list->V4V5_Ngon(i),mesh_V_count,mesh_F_count) )
        return false;
    }

    // Set validation counts to proper values because we will 
    // assume this old ngon information is valid since the indices
    // are in range.  This assumption may not be valid, but
    // at least the ngon won't cause a crash.
    ngud->m_mesh_V_count = mesh_V_count;
    ngud->m_mesh_F_count = mesh_F_count;
  }

  return ( ngud->m_mesh_F_count == mesh_F_count && ngud->m_mesh_V_count == mesh_V_count );
}